

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::append<std::move_iterator<std::__cxx11::string*>,void>
          (SmallVectorImpl<std::__cxx11::string> *this,
          move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          in_start,move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   in_end)

{
  pointer pcVar1;
  size_type sVar2;
  size_type *psVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  
  uVar5 = (long)in_end._M_current - (long)in_start._M_current >> 5;
  uVar4 = (ulong)*(uint *)(this + 8);
  if (*(uint *)(this + 0xc) - uVar4 < uVar5) {
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,uVar4 + uVar5);
    uVar4 = (ulong)*(uint *)(this + 8);
  }
  if (in_start._M_current != in_end._M_current) {
    psVar3 = (size_type *)(*(long *)this + uVar4 * 0x20 + 0x10);
    paVar6 = &(in_start._M_current)->field_2;
    do {
      psVar3[-2] = (size_type)psVar3;
      pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))
               ->_M_dataplus)._M_p;
      if (paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1) {
        sVar2 = *(size_type *)((long)paVar6 + 8);
        *psVar3 = paVar6->_M_allocated_capacity;
        psVar3[1] = sVar2;
      }
      else {
        psVar3[-2] = (size_type)pcVar1;
        *psVar3 = paVar6->_M_allocated_capacity;
      }
      psVar3[-1] = *(size_type *)((long)paVar6 + -8);
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
      _M_dataplus)._M_p = (pointer)paVar6;
      *(size_type *)((long)paVar6 + -8) = 0;
      paVar6->_M_local_buf[0] = '\0';
      psVar3 = psVar3 + 4;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + 1);
      paVar6 = paVar6 + 2;
    } while (pbVar7 != in_end._M_current);
    uVar4 = (ulong)*(uint *)(this + 8);
  }
  if (uVar5 + uVar4 <= (ulong)*(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)(uVar5 + uVar4);
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }